

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

WeierstrassPoint * ecc_weierstrass_multiply(WeierstrassPoint *B,mp_int *n)

{
  uint swap;
  WeierstrassPoint *orig;
  WeierstrassPoint *P;
  WeierstrassPoint *Q;
  size_t bit;
  uint overwrite;
  WeierstrassPoint *Q_00;
  WeierstrassPoint *P_00;
  
  orig = ecc_weierstrass_double(B);
  P = ecc_weierstrass_point_copy(B);
  Q = ecc_weierstrass_point_copy(orig);
  bit = mp_max_bits(n);
  if (bit != 0) {
    overwrite = 1;
    Q_00 = Q;
    P_00 = P;
    do {
      bit = bit - 1;
      swap = mp_get_bit(n,bit);
      Q = ecc_weierstrass_add(P_00,Q_00);
      ecc_weierstrass_cond_swap(P_00,Q_00,swap);
      P = ecc_weierstrass_double(P_00);
      ecc_weierstrass_point_free(P_00);
      ecc_weierstrass_point_free(Q_00);
      ecc_weierstrass_cond_swap(P,Q,swap);
      ecc_weierstrass_cond_overwrite(P,B,overwrite);
      ecc_weierstrass_cond_overwrite(Q,orig,overwrite);
      overwrite = overwrite & ~swap;
      Q_00 = Q;
      P_00 = P;
    } while (bit != 0);
  }
  ecc_weierstrass_point_free(orig);
  ecc_weierstrass_point_free(Q);
  return P;
}

Assistant:

WeierstrassPoint *ecc_weierstrass_multiply(WeierstrassPoint *B, mp_int *n)
{
    WeierstrassPoint *two_B = ecc_weierstrass_double(B);
    WeierstrassPoint *k_B = ecc_weierstrass_point_copy(B);
    WeierstrassPoint *kplus1_B = ecc_weierstrass_point_copy(two_B);

    /*
     * This multiply routine more or less follows the shape of the
     * 'Montgomery ladder' technique that you have to use under the
     * extra constraint on addition in Montgomery curves, because it
     * was fresh in my mind and easier to just do it the same way. See
     * the comment in ecc_montgomery_multiply.
     */

    unsigned not_started_yet = 1;
    for (size_t bitindex = mp_max_bits(n); bitindex-- > 0 ;) {
        unsigned nbit = mp_get_bit(n, bitindex);

        WeierstrassPoint *sum = ecc_weierstrass_add(k_B, kplus1_B);
        ecc_weierstrass_cond_swap(k_B, kplus1_B, nbit);
        WeierstrassPoint *other = ecc_weierstrass_double(k_B);
        ecc_weierstrass_point_free(k_B);
        ecc_weierstrass_point_free(kplus1_B);
        k_B = other;
        kplus1_B = sum;
        ecc_weierstrass_cond_swap(k_B, kplus1_B, nbit);

        ecc_weierstrass_cond_overwrite(k_B, B, not_started_yet);
        ecc_weierstrass_cond_overwrite(kplus1_B, two_B, not_started_yet);
        not_started_yet &= ~nbit;
    }

    ecc_weierstrass_point_free(two_B);
    ecc_weierstrass_point_free(kplus1_B);
    return k_B;
}